

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parasail_aligner.cpp
# Opt level: O2

void process(unsigned_long *count_generated,PairSet *pairs,quad *q,int *SA,uchar *BWT,int *SID,
            vector<int,_std::allocator<int>_> *DB,char *sentinal,int *cutoff)

{
  int iVar1;
  pointer pqVar2;
  pointer pqVar3;
  int iVar4;
  int iVar5;
  int j;
  int local_54;
  ulong local_50;
  int local_44;
  int *local_40;
  ulong local_38;
  
  pqVar2 = (q->children).super__Vector_base<quad,_std::allocator<quad>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pqVar3 = (q->children).super__Vector_base<quad,_std::allocator<quad>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_38 = ((long)pqVar2 - (long)pqVar3) / 0x28;
  if (*cutoff <= q->lcp) {
    local_40 = SID;
    if (pqVar2 == pqVar3) {
      iVar4 = q->rb;
      local_54 = q->lb;
      while (local_54 <= iVar4) {
        local_50 = CONCAT44(local_50._4_4_,local_54);
        iVar5 = local_54;
        while (iVar5 < iVar4) {
          j = iVar5 + 1;
          pair_check(count_generated,pairs,&local_54,&j,SA,BWT,local_40,DB,sentinal);
          iVar5 = iVar5 + 1;
          iVar4 = q->rb;
        }
        local_54 = (int)local_50 + 1;
      }
    }
    else {
      local_44 = q->lb;
      iVar4 = q->rb;
      local_50 = 0;
      while (local_44 <= iVar4) {
        iVar5 = local_44 + 1;
        j = iVar5;
        local_54 = local_44;
        if (local_50 < local_38) {
          pqVar2 = (q->children).super__Vector_base<quad,_std::allocator<quad>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (pqVar2[local_50].lb <= local_44) {
            iVar1 = pqVar2[local_50].rb;
            j = iVar1 + 1;
            local_50 = local_50 + (iVar1 <= local_44);
          }
        }
        while (local_44 = iVar5, iVar5 = j, j <= iVar4) {
          pair_check(count_generated,pairs,&local_54,&j,SA,BWT,local_40,DB,sentinal);
          iVar4 = q->rb;
          j = iVar5 + 1;
          iVar5 = local_44;
        }
      }
    }
  }
  return;
}

Assistant:

inline static void process(
        unsigned long &count_generated,
        PairSet &pairs,
        const quad &q,
        const int * const restrict SA,
        const unsigned char * const restrict BWT,
        const int * const restrict SID,
        const vector<int> &DB,
        const char &sentinal,
        const int &cutoff)
{
    const size_t n_children = q.children.size();
    size_t child_index = 0;

    if (q.lcp < cutoff) return;

    if (n_children) {
        for (int i=q.lb; i<=q.rb; ++i) {
            int j = i+1;
            if (child_index < n_children) {
                if (i >= q.children[child_index].lb) {
                    j = q.children[child_index].rb+1;
                    if (i >= q.children[child_index].rb) {
                        ++child_index;
                    }
                }
            }
            for (/*nope*/; j<=q.rb; ++j) {
                pair_check(count_generated, pairs, i, j, SA, BWT, SID, DB, sentinal);
            }
        }
    }
    else {
        for (int i=q.lb; i<=q.rb; ++i) {
            for (int j=i+1; j<=q.rb; ++j) {
                pair_check(count_generated, pairs, i, j, SA, BWT, SID, DB, sentinal);
            }
        }
    }
}